

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.cc
# Opt level: O0

void BF_ecb_encrypt(uchar *in,uchar *out,BF_KEY *key,int enc)

{
  uint local_2c;
  uint local_28;
  uint32_t d [2];
  int encrypt_local;
  BF_KEY *key_local;
  uint8_t *out_local;
  uint8_t *in_local;
  
  local_2c = (uint)in[3] | (uint)in[2] << 8 | (uint)in[1] << 0x10 | (uint)*in << 0x18;
  local_28 = (uint)in[7] | (uint)in[6] << 8 | (uint)in[5] << 0x10 | (uint)in[4] << 0x18;
  d[0] = enc;
  unique0x100000c2 = key;
  if (enc == 0) {
    BF_decrypt(&local_2c,key);
  }
  else {
    BF_encrypt(&local_2c,key);
  }
  *out = (uchar)(local_2c >> 0x18);
  out[1] = (uchar)(local_2c >> 0x10);
  out[2] = (uchar)(local_2c >> 8);
  out[3] = (uchar)local_2c;
  out[4] = (uchar)(local_28 >> 0x18);
  out[5] = (uchar)(local_28 >> 0x10);
  out[6] = (uchar)(local_28 >> 8);
  out[7] = (uchar)local_28;
  return;
}

Assistant:

void BF_ecb_encrypt(const uint8_t *in, uint8_t *out, const BF_KEY *key,
                    int encrypt) {
  uint32_t d[2];

  n2l(in, d[0]);
  n2l(in, d[1]);
  if (encrypt) {
    BF_encrypt(d, key);
  } else {
    BF_decrypt(d, key);
  }
  l2n(d[0], out);
  l2n(d[1], out);
}